

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setControlWeight
          (L2NormCost *this,VectorDynSize *controlWeights)

{
  bool bVar1;
  char *pcVar2;
  
  if ((this->m_pimpl->controlCost).m_valid == true) {
    bVar1 = CostAttributes::setWeightMatrix(&this->m_pimpl->controlCost,controlWeights);
    if (bVar1) {
      return true;
    }
    pcVar2 = "Error when specifying the control weights.";
  }
  else {
    pcVar2 = "The control cost portion has been deactivated, given the provided selectors.";
  }
  iDynTree::reportError("L2NormCost","setControlWeight",pcVar2);
  return false;
}

Assistant:

bool L2NormCost::setControlWeight(const VectorDynSize &controlWeights)
        {
            if (!(m_pimpl->controlCost.isValid())) {
                reportError("L2NormCost", "setControlWeight", "The control cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!(m_pimpl->controlCost.setWeightMatrix(controlWeights))) {
                reportError("L2NormCost", "setControlWeight", "Error when specifying the control weights.");
                return false;
            }

            return true;
        }